

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

HighsHashTableEntry<int,_int> *
HighsHashTree<int,int>::findCommonInLeaf<2,4>(InnerLeaf<2> *leaf1,InnerLeaf<4> *leaf2,int hashPos)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  unsigned_long uVar7;
  unsigned_long *puVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  HighsHashTableEntry<int,_int> *local_48;
  
  uVar1 = (leaf1->occupation).occupation;
  uVar2 = (leaf2->occupation).occupation;
  uVar11 = uVar2 & uVar1;
  if (uVar11 == 0) {
LAB_0027bc18:
    local_48 = (HighsHashTableEntry<int,_int> *)0x0;
  }
  else {
    iVar16 = -1;
    iVar13 = -1;
    do {
      if (uVar11 == 0) goto LAB_0027bc18;
      uVar4 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar9 = (uint)uVar4;
      lVar12 = POPCOUNT(uVar1 >> ((byte)uVar4 & 0x3f));
      iVar5 = (int)lVar12;
      iVar10 = iVar16 + iVar5;
      if (uVar9 != ((uint)(leaf1->hashes)._M_elems[iVar10] >> 10 & 0x3f)) {
        puVar8 = (leaf1->hashes)._M_elems + iVar16 + lVar12 + 1;
        do {
          iVar16 = iVar16 + 1;
          uVar7 = *puVar8;
          puVar8 = puVar8 + 1;
        } while (uVar9 != ((uint)uVar7 >> 10 & 0x3f));
        iVar10 = iVar5 + iVar16;
      }
      lVar12 = POPCOUNT(uVar2 >> ((byte)uVar4 & 0x3f));
      iVar5 = (int)lVar12;
      uVar14 = iVar13 + iVar5;
      if (uVar9 != ((uint)(leaf2->hashes)._M_elems[(int)uVar14] >> 10 & 0x3f)) {
        puVar8 = (leaf2->hashes)._M_elems + iVar13 + lVar12 + 1;
        do {
          iVar13 = iVar13 + 1;
          uVar7 = *puVar8;
          puVar8 = puVar8 + 1;
        } while (uVar9 != ((uint)uVar7 >> 10 & 0x3f));
        uVar14 = iVar5 + iVar13;
      }
      uVar15 = (ulong)uVar14;
      uVar11 = uVar11 ^ 1L << (uVar4 & 0x3f);
      do {
        uVar4 = (leaf1->hashes)._M_elems[iVar10];
        uVar15 = (ulong)(int)uVar15;
        while (uVar3 = (leaf2->hashes)._M_elems[uVar15], uVar4 <= uVar3) {
          if (uVar3 <= uVar4) {
            if ((leaf1->entries)._M_elems[iVar10].key_ == (leaf2->entries)._M_elems[uVar15].key_) {
              local_48 = (leaf1->entries)._M_elems + iVar10;
              bVar6 = false;
              goto LAB_0027bc0e;
            }
            bVar6 = true;
            if (((iVar10 + 1 == leaf1->size) ||
                (uVar9 != ((uint)(leaf1->hashes)._M_elems[iVar10 + 1] >> 10 & 0x3f))) ||
               ((int)uVar15 - leaf2->size == -1)) goto LAB_0027bc0e;
            uVar15 = uVar15 + 1;
            uVar14 = (uint)(leaf2->hashes)._M_elems[(int)uVar15];
            goto LAB_0027bbee;
          }
          uVar15 = uVar15 + 1;
          bVar6 = true;
          if (((int)uVar15 == leaf2->size) ||
             (uVar9 != ((uint)(leaf2->hashes)._M_elems[(int)uVar15] >> 10 & 0x3f)))
          goto LAB_0027bc0e;
        }
        bVar6 = true;
        if (iVar10 + 1 == leaf1->size) break;
        uVar14 = (uint)(leaf1->hashes)._M_elems[iVar10 + 1];
LAB_0027bbee:
        iVar10 = iVar10 + 1;
        bVar6 = true;
      } while (uVar9 == (uVar14 >> 10 & 0x3f));
LAB_0027bc0e:
    } while (bVar6);
  }
  return local_48;
}

Assistant:

operator uint64_t() const { return occupation; }